

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeSetEtaMaxErrFail(void *cvode_mem,sunrealtype eta_max_ef)

{
  long in_RDI;
  double in_XMM0_Qa;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x24a,"CVodeSetEtaMaxErrFail",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if ((in_XMM0_Qa <= 0.0) || (1.0 <= in_XMM0_Qa)) {
      *(undefined8 *)(in_RDI + 0x338) = 0x3fc999999999999a;
    }
    else {
      *(double *)(in_RDI + 0x338) = in_XMM0_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetEtaMaxErrFail(void* cvode_mem, sunrealtype eta_max_ef)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  /* set allowed value or use default */
  if (eta_max_ef <= ZERO || eta_max_ef >= ONE)
  {
    cv_mem->cv_eta_max_ef = ETA_MAX_EF_DEFAULT;
  }
  else { cv_mem->cv_eta_max_ef = eta_max_ef; }

  return (CV_SUCCESS);
}